

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary-ops.cpp
# Opt level: O0

void ggml_compute_forward_sqr(ggml_compute_params *params,ggml_tensor *dst)

{
  ggml_tensor *in_RDI;
  ggml_compute_params *unaff_retaddr;
  
  unary_op<&(op_sqr(float))>(unaff_retaddr,in_RDI);
  return;
}

Assistant:

void ggml_compute_forward_sqr(const ggml_compute_params * params, ggml_tensor * dst) {
    unary_op<op_sqr>(params, dst);
}